

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O0

void amrex::sum_fine_to_coarse
               (MultiFab *S_fine,MultiFab *S_crse,int scomp,int ncomp,IntVect *ratio,Geometry *cgeom
               ,Geometry *param_7)

{
  bool bVar1;
  DistributionMapping *pDVar2;
  int in_ECX;
  int in_EDX;
  FabArrayBase *in_RDI;
  int *in_R8;
  Periodicity PVar3;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *finearr;
  Array4<double> *crsearr;
  Box *bx;
  MFIter mfi;
  MultiFab crse_S_fine;
  BoxArray crse_S_fine_BA;
  int nGrow;
  int iref;
  int jref;
  int kref;
  Real c;
  int kk;
  int jj;
  int ii;
  Real volfrac;
  int facz;
  int facy;
  int facx;
  BoxArray *in_stack_fffffffffffffa18;
  BoxArray *in_stack_fffffffffffffa20;
  BoxArray *this;
  undefined4 in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  undefined4 in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa44;
  undefined1 do_tiling_;
  int in_stack_fffffffffffffa48;
  int in_stack_fffffffffffffa4c;
  Geometry *in_stack_fffffffffffffa50;
  BoxArray *in_stack_fffffffffffffa58;
  long *plVar4;
  MultiFab *in_stack_fffffffffffffa60;
  BoxArray *in_stack_fffffffffffffa68;
  long *plVar5;
  FabFactory<amrex::FArrayBox> *factory;
  int iVar6;
  int iVar7;
  FabArray<amrex::FArrayBox> *this_00;
  MFIter *this_01;
  Periodicity *local_568;
  undefined4 local_548;
  undefined4 local_544;
  undefined4 local_540;
  undefined4 local_53c;
  long local_4f8 [8];
  long *local_4b8;
  long local_4b0 [8];
  long *local_470;
  undefined1 local_464 [132];
  FabFactory<amrex::FArrayBox> local_3e0;
  FabArray<amrex::FArrayBox> local_3d8;
  MFIter local_220;
  int local_1b4;
  int *local_1a8;
  int local_1a0;
  int local_19c;
  FabArrayBase *local_190;
  tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_> local_188;
  int local_180;
  Geometry *local_178;
  int local_16c;
  int iStack_168;
  int local_164;
  undefined8 local_160;
  int local_158;
  Geometry *local_150;
  int local_148;
  int iStack_144;
  int local_140;
  undefined4 local_13c;
  undefined1 *local_138;
  undefined4 local_12c;
  undefined1 *local_128;
  undefined4 local_11c;
  int *local_118;
  undefined4 local_10c;
  Geometry *local_108;
  undefined4 local_fc;
  Geometry *local_f8;
  undefined4 local_ec;
  Geometry *local_e8;
  undefined4 local_dc;
  int *local_d8;
  int local_cc;
  int local_c8;
  int local_c4;
  double local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  double local_a8;
  int local_9c;
  int local_98;
  int local_94;
  undefined4 local_84;
  long *local_80;
  long *local_78;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  undefined4 local_5c;
  undefined4 local_4c;
  undefined4 local_3c;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  long *local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long *local_8;
  
  local_1a8 = in_R8;
  local_1a0 = in_ECX;
  local_19c = in_EDX;
  local_190 = in_RDI;
  local_1b4 = FabArrayBase::nGrow(in_RDI,0);
  local_d8 = local_1a8;
  local_dc = 0;
  local_1b4 = local_1b4 / *local_1a8;
  FabArrayBase::boxArray(local_190);
  this_01 = &local_220;
  BoxArray::BoxArray(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  BoxArray::coarsen(in_stack_fffffffffffffa68,(IntVect *)in_stack_fffffffffffffa60);
  pDVar2 = FabArrayBase::DistributionMap(local_190);
  local_3d8.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ = 0;
  local_3d8.super_FabArrayBase.boxarray.m_bat.m_op._12_8_ = 0;
  local_3d8.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
  local_3d8.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
  local_3d8.super_FabArrayBase.boxarray.m_bat.m_op._20_8_ = 0;
  this_00 = &local_3d8;
  iVar6 = local_1a0;
  iVar7 = local_1b4;
  MFInfo::MFInfo((MFInfo *)0x12d9483);
  local_3e0._vptr_FabFactory = (_func_int **)0x0;
  factory = &local_3e0;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffa20);
  MultiFab::MultiFab(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                     (DistributionMapping *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c,
                     in_stack_fffffffffffffa48,
                     (MFInfo *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),factory
                    );
  do_tiling_ = (undefined1)((uint)in_stack_fffffffffffffa44 >> 0x18);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x12d94e3);
  MFInfo::~MFInfo((MFInfo *)0x12d94f0);
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)in_stack_fffffffffffffa50,
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                 (bool)do_tiling_);
  while (bVar1 = MFIter::isValid((MFIter *)(local_464 + 0x24)), bVar1) {
    in_stack_fffffffffffffa50 = (Geometry *)local_464;
    MFIter::growntilebox(this_01,(int)((ulong)this_00 >> 0x20));
    plVar4 = local_4b0;
    local_464._28_8_ = in_stack_fffffffffffffa50;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (MFIter *)in_stack_fffffffffffffa20);
    plVar5 = local_4f8;
    local_470 = plVar4;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
               (MFIter *)in_stack_fffffffffffffa20);
    local_178 = (Geometry *)local_464._28_8_;
    local_e8 = (Geometry *)local_464._28_8_;
    local_ec = 0;
    local_16c = *(int *)&(((__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                            *)&((CoordSys *)local_464._28_8_)->c_sys)->
                         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                         )._M_t.
                         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                         .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    local_f8 = (Geometry *)local_464._28_8_;
    local_fc = 1;
    iStack_168 = *(int *)&((CoordSys *)local_464._28_8_)->field_0x4;
    local_188.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_> *)
          (CoordSys *)local_464._28_8_;
    local_108 = (Geometry *)local_464._28_8_;
    local_10c = 2;
    local_180 = *(int *)((CoordSys *)local_464._28_8_)->offset;
    local_150 = (Geometry *)local_464._28_8_;
    local_118 = (int *)((long)((CoordSys *)local_464._28_8_)->offset + 4);
    local_11c = 0;
    local_148 = *local_118;
    local_128 = (undefined1 *)((long)((CoordSys *)local_464._28_8_)->offset + 4);
    local_12c = 1;
    iStack_144 = ((IntVect *)(((CoordSys *)local_464._28_8_)->offset + 1))->vect[0];
    local_160 = *(undefined8 *)local_118;
    local_138 = (undefined1 *)((long)((CoordSys *)local_464._28_8_)->offset + 4);
    local_13c = 2;
    local_158 = *(int *)((long)((CoordSys *)local_464._28_8_)->offset + 0xc);
    for (local_53c = 0; local_540 = local_180, (int)local_53c < local_1a0; local_53c = local_53c + 1
        ) {
      for (; local_544 = iStack_168, (int)local_540 <= local_158; local_540 = local_540 + 1) {
        for (; local_548 = local_16c, (int)local_544 <= iStack_144; local_544 = local_544 + 1) {
          for (; (int)local_548 <= local_148; local_548 = local_548 + 1) {
            local_60 = local_548;
            local_64 = local_544;
            local_68 = local_540;
            local_6c = local_53c;
            local_78 = local_470;
            local_84 = 0;
            local_3c = 0;
            local_94 = *local_1a8;
            local_4c = 1;
            local_98 = local_1a8[1];
            local_5c = 2;
            local_9c = local_1a8[2];
            local_a8 = 1.0 / (double)(local_94 * local_98 * local_9c);
            local_ac = local_548 * local_94;
            local_b0 = local_544 * local_98;
            local_b4 = local_540 * local_9c;
            local_c0 = 0.0;
            for (local_c4 = 0; local_c4 < local_9c; local_c4 = local_c4 + 1) {
              for (local_c8 = 0; local_c8 < local_98; local_c8 = local_c8 + 1) {
                for (local_cc = 0; local_cc < local_94; local_cc = local_cc + 1) {
                  local_24 = local_ac + local_cc;
                  local_28 = local_b0 + local_c8;
                  local_2c = local_b4 + local_c4;
                  local_30 = local_53c + local_19c;
                  local_c0 = *(double *)
                              (*plVar5 +
                              ((long)(local_24 - (int)plVar5[4]) +
                               (long)(local_28 - *(int *)((long)plVar5 + 0x24)) * plVar5[1] +
                               (long)(local_2c - (int)plVar5[5]) * plVar5[2] +
                              (long)local_30 * plVar5[3]) * 8) + local_c0;
                  local_20 = plVar5;
                }
              }
            }
            local_8 = local_470;
            local_c = local_548;
            local_10 = local_544;
            local_14 = local_540;
            local_18 = local_53c;
            *(double *)
             (*local_470 +
             ((long)(local_548 - (int)local_470[4]) +
              (long)(local_544 - *(int *)((long)local_470 + 0x24)) * local_470[1] +
              (long)(local_540 - (int)local_470[5]) * local_470[2] +
             (long)(int)local_53c * local_470[3]) * 8) = local_a8 * local_c0;
            local_80 = plVar5;
          }
        }
      }
    }
    local_4b8 = plVar5;
    local_164 = local_180;
    local_140 = local_158;
    MFIter::operator++((MFIter *)(local_464 + 0x24));
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffffa20);
  PVar3 = Geometry::periodicity(in_stack_fffffffffffffa50);
  local_568 = PVar3.period.vect._0_8_;
  this = (BoxArray *)&stack0xfffffffffffffaa8;
  FabArray<amrex::FArrayBox>::ParallelCopy
            (this_00,(FabArray<amrex::FArrayBox> *)CONCAT44(iVar7,iVar6),
             (int)((ulong)pDVar2 >> 0x20),(int)pDVar2,(int)((ulong)factory >> 0x20),(int)factory,
             PVar3.period.vect[2],local_568,PVar3.period.vect[2]);
  MultiFab::~MultiFab((MultiFab *)0x12d9dc7);
  BoxArray::~BoxArray(this);
  return;
}

Assistant:

void sum_fine_to_coarse(const MultiFab& S_fine, MultiFab& S_crse,
                            int scomp, int ncomp, const IntVect& ratio,
                            const Geometry& cgeom, const Geometry& /*fgeom*/)
    {
        AMREX_ASSERT(S_crse.nComp() == S_fine.nComp());
        AMREX_ASSERT(ratio == ratio[0]);
        AMREX_ASSERT(S_fine.nGrow() % ratio[0] == 0);

        const int nGrow = S_fine.nGrow() / ratio[0];

        //
        // Coarsen() the fine stuff on processors owning the fine data.
        //
        BoxArray crse_S_fine_BA = S_fine.boxArray(); crse_S_fine_BA.coarsen(ratio);

        MultiFab crse_S_fine(crse_S_fine_BA, S_fine.DistributionMap(), ncomp, nGrow, MFInfo(), FArrayBoxFactory());

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && crse_S_fine.isFusingCandidate()) {
            auto const& crsema = crse_S_fine.arrays();
            auto const& finema = S_fine.const_arrays();
            ParallelFor(crse_S_fine, IntVect(nGrow), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                amrex_avgdown(i,j,k,n,crsema[box_no],finema[box_no],0,scomp,ratio);
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(crse_S_fine, TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                //  NOTE: The tilebox is defined at the coarse level.
                const Box& bx = mfi.growntilebox(nGrow);
                Array4<Real> const& crsearr = crse_S_fine.array(mfi);
                Array4<Real const> const& finearr = S_fine.const_array(mfi);

                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                {
                    amrex_avgdown(i,j,k,n,crsearr,finearr,0,scomp,ratio);
                });
            }
        }

        S_crse.ParallelCopy(crse_S_fine, 0, scomp, ncomp, nGrow, 0,
                            cgeom.periodicity(), FabArrayBase::ADD);
    }